

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O0

bool __thiscall OpenMD::Globals::addRestraintStamp(Globals *this,RestraintStamp *rest)

{
  value_type *in_RDI;
  vector<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_> *unaff_retaddr;
  
  std::vector<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return true;
}

Assistant:

bool Globals::addRestraintStamp(RestraintStamp* rest) {
    restraints_.push_back(rest);
    return true;
  }